

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::ContactForceLoadResidual_F
          (ChBody *this,ChVector<double> *F,ChVector<double> *abs_point,ChVectorDynamic<> *R)

{
  double *pdVar1;
  long *plVar2;
  ulong *puVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  long lVar23;
  long unaff_RBX;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  long unaff_R12;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChVector<double> m_p1_loc;
  long local_50;
  undefined1 auStack_48 [16];
  double adStack_38 [3];
  
  ChTransform<double>::TransformParentToLocal
            (abs_point,
             &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos,
             &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix);
  dVar4 = F->m_data[1];
  auVar33._8_8_ = F->m_data[0];
  auVar33._0_8_ = F->m_data[0];
  auVar35._8_8_ = F->m_data[2];
  auVar35._0_8_ = F->m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = adStack_38[2];
  auVar30._0_8_ =
       dVar4 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x18);
  auVar30._8_8_ =
       dVar4 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x20);
  auVar15 = vfmadd231pd_fma(auVar30,auVar33,
                            *(undefined1 (*) [16])
                             (this->super_ChBodyFrame).super_ChFrameMoving<double>.
                             super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x10);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       dVar4 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x28);
  auVar5 = vfmadd231sd_fma(auVar31,auVar33,auVar5);
  auVar30 = vfmadd231pd_fma(auVar15,auVar35,
                            *(undefined1 (*) [16])
                             ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                                     super_ChFrame<double>.Amatrix.
                                     super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage + 0x30));
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x40);
  auVar15 = vfmadd231sd_fma(auVar5,auVar35,auVar15);
  auVar21._8_8_ = adStack_38[1];
  auVar21._0_8_ = adStack_38[0];
  auVar5 = vshufpd_avx(auVar30,auVar30,1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = adStack_38[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar5._0_8_ * adStack_38[2];
  auVar6 = vfmsub231sd_fma(auVar34,auVar15,auVar6);
  auVar5 = vunpcklpd_avx(auVar15,auVar30);
  auVar32._0_8_ = auVar5._0_8_ * adStack_38[0];
  auVar32._8_8_ = auVar5._8_8_ * adStack_38[1];
  auVar5 = vunpcklpd_avx(auVar36,auVar21);
  auStack_48 = vfmsub213pd_fma(auVar5,auVar30,auVar32);
  local_50 = auVar6._0_8_;
  uVar22 = (this->super_ChPhysicsItem).offset_w;
  lVar23 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
  ;
  if (lVar23 < (long)(ulong)uVar22) goto LAB_0050978d;
  pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar24 = 3;
  pdVar1 = pdVar7 + uVar22;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar25 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar25 < 3) {
      uVar24 = (ulong)uVar25;
    }
    if (uVar25 != 0) goto LAB_005096a3;
  }
  else {
LAB_005096a3:
    uVar26 = 0;
    do {
      pdVar1[uVar26] = F->m_data[uVar26] + pdVar1[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar24 != uVar26);
  }
  if (uVar24 < 3) {
    do {
      pdVar1[uVar24] = F->m_data[uVar24] + pdVar1[uVar24];
      uVar24 = uVar24 + 1;
    } while (uVar24 != 3);
  }
  if (lVar23 < (long)(ulong)(uVar22 + 3)) {
LAB_0050978d:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar7 = pdVar7 + (uVar22 + 3);
  uVar22 = 3;
  if (((ulong)pdVar7 & 7) == 0) {
    uVar25 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
    if (uVar25 < 3) {
      uVar22 = uVar25;
    }
    if (uVar25 == 0) goto LAB_0050973f;
  }
  auVar28 = vpbroadcastq_avx512f();
  uVar24 = vpcmpuq_avx512f(auVar28,_DAT_009552c0,5);
  bVar8 = (byte)uVar24;
  auVar28._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * auStack_48._0_8_;
  auVar28._0_8_ = (ulong)(bVar8 & 1) * auVar6._0_8_;
  auVar28._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * auStack_48._8_8_;
  auVar28._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * (long)adStack_38[0];
  auVar28._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * (long)adStack_38[1];
  auVar28._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * (long)adStack_38[2];
  auVar28._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * unaff_RBX;
  auVar28._56_8_ = (uVar24 >> 7) * unaff_R12;
  auVar29._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * (long)pdVar7[1];
  auVar29._0_8_ = (ulong)(bVar8 & 1) * (long)*pdVar7;
  auVar29._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * (long)pdVar7[2];
  auVar29._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * (long)pdVar7[3];
  auVar29._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * (long)pdVar7[4];
  auVar29._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * (long)pdVar7[5];
  auVar29._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * (long)pdVar7[6];
  auVar29._56_8_ = (uVar24 >> 7) * (long)pdVar7[7];
  auVar28 = vaddpd_avx512f(auVar28,auVar29);
  bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
  bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
  bVar12 = (bool)((byte)(uVar24 >> 4) & 1);
  bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
  bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
  *pdVar7 = (double)((ulong)(bVar8 & 1) * auVar28._0_8_ | (ulong)!(bool)(bVar8 & 1) * (long)*pdVar7)
  ;
  pdVar7[1] = (double)((ulong)bVar9 * auVar28._8_8_ | (ulong)!bVar9 * (long)pdVar7[1]);
  pdVar7[2] = (double)((ulong)bVar10 * auVar28._16_8_ | (ulong)!bVar10 * (long)pdVar7[2]);
  pdVar7[3] = (double)((ulong)bVar11 * auVar28._24_8_ | (ulong)!bVar11 * (long)pdVar7[3]);
  pdVar7[4] = (double)((ulong)bVar12 * auVar28._32_8_ | (ulong)!bVar12 * (long)pdVar7[4]);
  pdVar7[5] = (double)((ulong)bVar13 * auVar28._40_8_ | (ulong)!bVar13 * (long)pdVar7[5]);
  pdVar7[6] = (double)((ulong)bVar14 * auVar28._48_8_ | (ulong)!bVar14 * (long)pdVar7[6]);
  pdVar7[7] = (double)((uVar24 >> 7) * auVar28._56_8_ |
                      (ulong)!SUB81(uVar24 >> 7,0) * (long)pdVar7[7]);
LAB_0050973f:
  if (uVar22 < 3) {
    uVar26 = (ulong)(uVar22 << 3);
    auVar27 = vpbroadcastq_avx512vl();
    uVar24 = vpcmpuq_avx512vl(auVar27,_DAT_00955380,5);
    uVar24 = uVar24 & 0xf;
    lVar23 = *(long *)(auStack_48 + uVar26);
    lVar16 = *(long *)(auStack_48 + uVar26 + 8);
    lVar17 = *(long *)((long)adStack_38 + uVar26);
    bVar8 = (byte)uVar24;
    plVar2 = (long *)((long)pdVar7 + uVar26);
    lVar18 = plVar2[1];
    lVar19 = plVar2[2];
    lVar20 = plVar2[3];
    puVar3 = (ulong *)((long)pdVar7 + uVar26);
    bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
    bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
    *puVar3 = (ulong)(bVar8 & 1) *
              (long)((double)((ulong)(bVar8 & 1) * *(long *)(auStack_48 + (uVar26 - 8))) +
                    (double)((ulong)(bVar8 & 1) * *plVar2)) | (ulong)!(bool)(bVar8 & 1) * *puVar3;
    puVar3[1] = (ulong)bVar9 *
                (long)((double)((ulong)((byte)(uVar24 >> 1) & 1) * lVar23) +
                      (double)((ulong)((byte)(uVar24 >> 1) & 1) * lVar18)) |
                (ulong)!bVar9 * puVar3[1];
    puVar3[2] = (ulong)bVar10 *
                (long)((double)((ulong)((byte)(uVar24 >> 2) & 1) * lVar16) +
                      (double)((ulong)((byte)(uVar24 >> 2) & 1) * lVar19)) |
                (ulong)!bVar10 * puVar3[2];
    puVar3[3] = (uVar24 >> 3) *
                (long)((double)((uVar24 >> 3) * lVar17) + (double)((uVar24 >> 3) * lVar20)) |
                (ulong)!SUB81(uVar24 >> 3,0) * puVar3[3];
  }
  return;
}

Assistant:

void ChBody::ContactForceLoadResidual_F(const ChVector<>& F, const ChVector<>& abs_point, ChVectorDynamic<>& R) {
    ChVector<> m_p1_loc = this->Point_World2Body(abs_point);
    ChVector<> force1_loc = this->Dir_World2Body(F);
    ChVector<> torque1_loc = Vcross(m_p1_loc, force1_loc);
    R.segment(this->GetOffset_w() + 0, 3) += F.eigen();
    R.segment(this->GetOffset_w() + 3, 3) += torque1_loc.eigen();
}